

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathNameFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlNodeSetPtr pxVar1;
  xmlNodePtr val;
  xmlChar *pxVar2;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr pxVar3;
  xmlChar *val_00;
  undefined4 in_register_00000034;
  int iStack_20;
  
  pxVar3 = (xmlXPathObjectPtr)CONCAT44(in_register_00000034,nargs);
  if (nargs == 0) {
    pxVar3 = xmlXPathCacheNewNodeSet(ctxt->context,ctxt->context->node);
    valuePush(ctxt,pxVar3);
  }
  else {
    if (ctxt == (xmlXPathParserContextPtr)0x0) {
      return;
    }
    if (nargs != 1) {
      iStack_20 = 0xc;
      goto LAB_001da5e9;
    }
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    iStack_20 = 0x17;
LAB_001da5e9:
    xmlXPathErr(ctxt,iStack_20);
    return;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((ctxt->value->type | XPATH_USERS) != XPATH_XSLT_TREE)) {
    iStack_20 = 0xb;
    goto LAB_001da5e9;
  }
  obj = valuePop(ctxt);
  pxVar1 = obj->nodesetval;
  if ((pxVar1 == (xmlNodeSetPtr)0x0) || (pxVar1->nodeNr == 0)) {
LAB_001da5b4:
    pxVar3 = xmlXPathCacheNewCString(ctxt->context,(char *)pxVar3);
  }
  else {
    val = *pxVar1->nodeTab;
    if (1 < val->type - XML_ELEMENT_NODE) {
      pxVar3 = xmlXPathCacheNewNodeSet(ctxt->context,val);
      valuePush(ctxt,pxVar3);
      xmlXPathLocalNameFunction(ctxt,1);
      goto LAB_001da5c8;
    }
    pxVar3 = (xmlXPathObjectPtr)val->name;
    if ((char)pxVar3->type == 0x20) goto LAB_001da5b4;
    if ((val->ns == (xmlNs *)0x0) || (pxVar2 = val->ns->prefix, pxVar2 == (xmlChar *)0x0)) {
      pxVar3 = xmlXPathCacheNewString(ctxt->context,(xmlChar *)pxVar3);
    }
    else {
      val_00 = xmlBuildQName((xmlChar *)pxVar3,pxVar2,(xmlChar *)0x0,0);
      pxVar2 = (*obj->nodesetval->nodeTab)->name;
      if (val_00 == pxVar2) {
        val_00 = xmlStrdup(pxVar2);
      }
      if (val_00 == (xmlChar *)0x0) {
        iStack_20 = 0xf;
        goto LAB_001da5e9;
      }
      pxVar3 = xmlXPathCacheWrapString(ctxt->context,val_00);
    }
  }
  valuePush(ctxt,pxVar3);
LAB_001da5c8:
  xmlXPathReleaseObject(ctxt->context,obj);
  return;
}

Assistant:

static void
xmlXPathNameFunction(xmlXPathParserContextPtr ctxt, int nargs)
{
    xmlXPathObjectPtr cur;

    if (nargs == 0) {
	valuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt->context,
	    ctxt->context->node));
        nargs = 1;
    }

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
        ((ctxt->value->type != XPATH_NODESET) &&
         (ctxt->value->type != XPATH_XSLT_TREE)))
        XP_ERROR(XPATH_INVALID_TYPE);
    cur = valuePop(ctxt);

    if ((cur->nodesetval == NULL) || (cur->nodesetval->nodeNr == 0)) {
        valuePush(ctxt, xmlXPathCacheNewCString(ctxt->context, ""));
    } else {
        int i = 0;              /* Should be first in document order !!!!! */

        switch (cur->nodesetval->nodeTab[i]->type) {
            case XML_ELEMENT_NODE:
            case XML_ATTRIBUTE_NODE:
		if (cur->nodesetval->nodeTab[i]->name[0] == ' ')
		    valuePush(ctxt,
			xmlXPathCacheNewCString(ctxt->context, ""));
		else if ((cur->nodesetval->nodeTab[i]->ns == NULL) ||
                         (cur->nodesetval->nodeTab[i]->ns->prefix == NULL)) {
		    valuePush(ctxt,
		        xmlXPathCacheNewString(ctxt->context,
			    cur->nodesetval->nodeTab[i]->name));
		} else {
		    xmlChar *fullname;

		    fullname = xmlBuildQName(cur->nodesetval->nodeTab[i]->name,
				     cur->nodesetval->nodeTab[i]->ns->prefix,
				     NULL, 0);
		    if (fullname == cur->nodesetval->nodeTab[i]->name)
			fullname = xmlStrdup(cur->nodesetval->nodeTab[i]->name);
		    if (fullname == NULL) {
			XP_ERROR(XPATH_MEMORY_ERROR);
		    }
		    valuePush(ctxt, xmlXPathCacheWrapString(
			ctxt->context, fullname));
                }
                break;
            default:
		valuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt->context,
		    cur->nodesetval->nodeTab[i]));
                xmlXPathLocalNameFunction(ctxt, 1);
        }
    }
    xmlXPathReleaseObject(ctxt->context, cur);
}